

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR yang_parse_submodule
                 (lysp_yang_ctx **context,ly_ctx *ly_ctx,lysp_ctx *main_ctx,ly_in *in,
                 lysp_submodule **submod)

{
  ly_set *plVar1;
  LY_ERR LVar2;
  lysp_yang_ctx *plVar3;
  lysp_submodule *submod_00;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  ly_stmt kw;
  lysf_ctx fctx;
  size_t word_len;
  char *word;
  ly_stmt local_6c;
  lysf_ctx local_68;
  size_t local_40;
  char *local_38;
  
  local_68.mod = (lys_module *)0x0;
  local_68.ext_set.size = 0;
  local_68.ext_set.count = 0;
  local_68.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_68.ctx = ly_ctx;
  if ((((context == (lysp_yang_ctx **)0x0) || (ly_ctx == (ly_ctx *)0x0)) ||
      (main_ctx == (lysp_ctx *)0x0)) || ((in == (ly_in *)0x0 || (submod == (lysp_submodule **)0x0)))
     ) {
    __assert_fail("context && ly_ctx && main_ctx && in && submod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                  ,0x1297,
                  "LY_ERR yang_parse_submodule(struct lysp_yang_ctx **, struct ly_ctx *, struct lysp_ctx *, struct ly_in *, struct lysp_submodule **)"
                 );
  }
  plVar3 = (lysp_yang_ctx *)calloc(1,0x60);
  *context = plVar3;
  if (plVar3 == (lysp_yang_ctx *)0x0) {
    ly_log(ly_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_submodule");
    return LY_EMEM;
  }
  plVar3->format = LYS_IN_YANG;
  plVar3->in = in;
  plVar3->main_ctx = main_ctx;
  submod_00 = (lysp_submodule *)calloc(1,0xb8);
  if (submod_00 == (lysp_submodule *)0x0) {
    LVar2 = LY_EMEM;
    ly_log(ly_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_submodule");
  }
  else {
    plVar1 = main_ctx->parsed_mods;
    submod_00->mod = *(lys_module **)(plVar1->field_2).dnodes[plVar1->count - 1];
    submod_00->field_0x79 = submod_00->field_0x79 | 1;
    plVar3->parsed_mods = plVar1;
    ly_set_add(plVar1,submod_00,'\x01',(uint32_t *)0x0);
    ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,in);
    LVar2 = skip_redundant_chars(*context);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = get_keyword(*context,&local_6c,&local_38,&local_40), LVar2 == LY_SUCCESS)) {
      if (local_6c == LY_STMT_SUBMODULE) {
        LVar2 = parse_submodule(*context,submod_00);
        if ((LVar2 != LY_SUCCESS) || (LVar2 = skip_redundant_chars(*context), LVar2 != LY_SUCCESS))
        goto LAB_00181524;
        pcVar4 = in->current;
        if (*pcVar4 == '\0') {
          submod_00->field_0x79 = submod_00->field_0x79 & 0xfe;
          *submod = submod_00;
          LVar2 = LY_SUCCESS;
          goto LAB_00181524;
        }
        if (*context == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar1 = (*context)->parsed_mods;
          plVar7 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
        }
        sVar5 = strlen(pcVar4);
        pcVar6 = "";
        if (0xf < sVar5) {
          pcVar6 = "...";
        }
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX,
                "Trailing garbage \"%.*s%s\" after submodule, expected end-of-input.",0xf,pcVar4,
                pcVar6);
      }
      else {
        if (local_6c == LY_STMT_MODULE) {
          ly_log(ly_ctx,LY_LLERR,LY_EDENIED,
                 "Input data contains module in situation when a submodule is expected.");
          LVar2 = LY_EINVAL;
          goto LAB_00181524;
        }
        if (*context == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar1 = (*context)->parsed_mods;
          plVar7 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(local_6c);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX,
                "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar4);
      }
      LVar2 = LY_EVALID;
    }
  }
LAB_00181524:
  ly_log_location_revert(0,0,0,1);
  if (LVar2 != LY_SUCCESS) {
    lysp_module_free(&local_68,(lysp_module *)submod_00);
    lysp_yang_ctx_free(*context);
    *context = (lysp_yang_ctx *)0x0;
  }
  return LVar2;
}

Assistant:

LY_ERR
yang_parse_submodule(struct lysp_yang_ctx **context, struct ly_ctx *ly_ctx, struct lysp_ctx *main_ctx,
        struct ly_in *in, struct lysp_submodule **submod)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_submodule *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = ly_ctx};

    assert(context && ly_ctx && main_ctx && in && submod);

    /* create context */
    *context = calloc(1, sizeof **context);
    LY_CHECK_ERR_RET(!(*context), LOGMEM(ly_ctx), LY_EMEM);
    (*context)->format = LYS_IN_YANG;
    (*context)->in = in;
    (*context)->main_ctx = main_ctx;

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(ly_ctx); ret = LY_EMEM, cleanup);
    mod_p->mod = PARSER_CUR_PMOD(main_ctx)->mod;
    mod_p->parsing = 1;

    /* use main context parsed mods adding the current one */
    (*context)->parsed_mods = main_ctx->parsed_mods;
    ly_set_add((*context)->parsed_mods, mod_p, 1, NULL);

    ly_log_location(NULL, NULL, NULL, in);

    /* skip redundant but valid characters at the beginning */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);

    /* "module"/"submodule" */
    ret = get_keyword(*context, &kw, &word, &word_len);
    LY_CHECK_GOTO(ret, cleanup);

    if (kw == LY_STMT_MODULE) {
        LOGERR(ly_ctx, LY_EDENIED, "Input data contains module in situation when a submodule is expected.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_SUBMODULE) {
        LOGVAL_PARSER(*context, LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* substatements */
    ret = parse_submodule(*context, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip redundant but valid characters at the end */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);
    if (in->current[0]) {
        LOGVAL_PARSER(*context, LY_VCODE_TRAILING_SUBMOD, 15, in->current, strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod_p->parsing = 0;
    *submod = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, (struct lysp_module *)mod_p);
        lysp_yang_ctx_free(*context);
        *context = NULL;
    }

    return ret;
}